

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.hpp
# Opt level: O0

void __thiscall antlr::TreeParser::match(TreeParser *this,RefAST *t,BitSet *b)

{
  bool bVar1;
  undefined4 uVar2;
  AST *pAVar3;
  AST *pAVar4;
  ASTRefCount<antlr::AST> *other;
  ASTRefCount<antlr::AST> *this_00;
  ASTRefCount *in_RSI;
  long *in_RDI;
  bool in_stack_0000000f;
  BitSet *in_stack_00000010;
  RefAST *in_stack_00000018;
  int in_stack_00000024;
  char **in_stack_00000028;
  MismatchedTokenException *in_stack_00000030;
  BitSet *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  BitSet *in_stack_ffffffffffffff68;
  
  pAVar3 = ASTRefCount::operator_cast_to_AST_(in_RSI);
  if (pAVar3 != (AST *)0x0) {
    pAVar3 = ASTRefCount::operator_cast_to_AST_(in_RSI);
    pAVar4 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)&ASTNULL);
    if (pAVar3 != pAVar4) {
      pAVar3 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
      (*pAVar3->_vptr_AST[0x10])();
      bVar1 = BitSet::member(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      if (bVar1) {
        return;
      }
    }
  }
  other = (ASTRefCount<antlr::AST> *)__cxa_allocate_exception(200);
  this_00 = (ASTRefCount<antlr::AST> *)(**(code **)(*in_RDI + 0x40))();
  uVar2 = (**(code **)(*in_RDI + 0x38))();
  ASTRefCount<antlr::AST>::ASTRefCount(this_00,other);
  BitSet::BitSet((BitSet *)CONCAT44(uVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
  MismatchedTokenException::MismatchedTokenException
            (in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018,
             in_stack_00000010,in_stack_0000000f);
  __cxa_throw(other,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

virtual void match(RefAST t, const BitSet& b)
	{
		if ( !t || t==ASTNULL || !b.member(t->getType()) )
			throw MismatchedTokenException( getTokenNames(), getNumTokens(),
													  t, b, false );
	}